

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

Cbs2_Man_t * Cbs2_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  Cbs2_Man_t *pPars;
  int *piVar2;
  Vec_Int_t *pVVar3;
  Cbs2_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pPars = (Cbs2_Man_t *)calloc(1,400);
  (pPars->pClauses).nSize = 10000;
  (pPars->pJust).nSize = 10000;
  (pPars->pProp).nSize = 10000;
  piVar2 = (int *)malloc((long)(pPars->pProp).nSize << 2);
  (pPars->pProp).pData = piVar2;
  piVar2 = (int *)malloc((long)(pPars->pJust).nSize << 2);
  (pPars->pJust).pData = piVar2;
  piVar2 = (int *)malloc((long)(pPars->pClauses).nSize << 2);
  (pPars->pClauses).pData = piVar2;
  (pPars->pClauses).iTail = 1;
  (pPars->pClauses).iHead = 1;
  pVVar3 = Vec_IntAlloc(1000);
  pPars->vModel = pVVar3;
  pVVar3 = Vec_IntAlloc(1000);
  pPars->vTemp = pVVar3;
  pPars->pAig = pGia;
  Cbs2_SetDefaultParams((Cbs2_Par_t *)pPars);
  iVar1 = Gia_ManObjNum(pGia);
  Vec_StrFill(&pPars->vAssign,iVar1,'\x02');
  iVar1 = Gia_ManObjNum(pGia);
  Vec_StrFill(&pPars->vMark,iVar1,'\0');
  iVar1 = Gia_ManObjNum(pGia);
  Vec_IntFill(&pPars->vLevReason,iVar1 * 3,-1);
  iVar1 = Gia_ManObjNum(pGia);
  Vec_IntFill(&pPars->vWatches,iVar1 << 1,0);
  iVar1 = Gia_ManObjNum(pGia);
  Vec_IntFill(&pPars->vFanout0,iVar1,0);
  iVar1 = Gia_ManObjNum(pGia);
  Vec_IntFill(&pPars->vFanoutN,iVar1 << 1,0);
  iVar1 = Gia_ManObjNum(pGia);
  Vec_IntFill(&pPars->vActivity,iVar1,0);
  Vec_IntGrow(&pPars->vActStore,1000);
  Vec_IntGrow(&pPars->vJStore,1000);
  Vec_IntGrow(&pPars->vWatchUpds,1000);
  return pPars;
}

Assistant:

Cbs2_Man_t * Cbs2_ManAlloc( Gia_Man_t * pGia )
{
    Cbs2_Man_t * p;
    p = ABC_CALLOC( Cbs2_Man_t, 1 );
    p->pProp.nSize = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData = ABC_ALLOC( int, p->pProp.nSize );
    p->pJust.pData = ABC_ALLOC( int, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( int, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel   = Vec_IntAlloc( 1000 );
    p->vTemp    = Vec_IntAlloc( 1000 );
    p->pAig     = pGia;
    Cbs2_SetDefaultParams( &p->Pars );
    Vec_StrFill( &p->vAssign,    Gia_ManObjNum(pGia), 2 );
    Vec_StrFill( &p->vMark,      Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vLevReason, 3*Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vWatches,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vFanout0,   Gia_ManObjNum(pGia),   0 );
    Vec_IntFill( &p->vFanoutN,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vActivity,  Gia_ManObjNum(pGia), 0 );
    Vec_IntGrow( &p->vActStore,  1000 );
    Vec_IntGrow( &p->vJStore,    1000 );
    Vec_IntGrow( &p->vWatchUpds, 1000 );
    return p;
}